

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

void __thiscall ProStringList::ProStringList(ProStringList *this,QStringList *list)

{
  long lVar1;
  QString *str;
  QString *str_00;
  long in_FS_OFFSET;
  ProString PStack_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QList<ProString>).d.d = (Data *)0x0;
  (this->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (this->super_QList<ProString>).d.size = 0;
  QList<ProString>::reserve(&this->super_QList<ProString>,(list->d).size);
  str_00 = (list->d).ptr;
  for (lVar1 = (list->d).size * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    ProString::ProString(&PStack_58,str_00);
    QList<ProString>::emplaceBack<ProString_const&>(&this->super_QList<ProString>,&PStack_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_58);
    str_00 = str_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList::ProStringList(const QStringList &list)
{
    reserve(list.size());
    for (const QString &str : list)
        *this << ProString(str);
}